

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

bool cs_impl::compare_if<std::pair<cs_impl::any,_cs_impl::any>,_true>::compare
               (pair<cs_impl::any,_cs_impl::any> *a,pair<cs_impl::any,_cs_impl::any> *b)

{
  proxy *ppVar1;
  proxy *ppVar2;
  baseHolder *pbVar3;
  int iVar4;
  char cVar5;
  
  ppVar1 = (a->first).mDat;
  ppVar2 = (b->first).mDat;
  cVar5 = ppVar2 == (proxy *)0x0;
  if (ppVar1 != (proxy *)0x0) {
    if (ppVar2 == (proxy *)0x0) {
      return false;
    }
    pbVar3 = ppVar1->data;
    iVar4 = (*pbVar3->_vptr_baseHolder[4])(pbVar3,ppVar2->data);
    cVar5 = (char)iVar4;
  }
  if (cVar5 == '\0') {
    return false;
  }
  ppVar1 = (a->second).mDat;
  ppVar2 = (b->second).mDat;
  if (ppVar2 != (proxy *)0x0 && ppVar1 != (proxy *)0x0) {
    iVar4 = (*ppVar1->data->_vptr_baseHolder[4])(ppVar1->data,ppVar2->data);
    return SUB41(iVar4,0);
  }
  return ppVar1 == (proxy *)0x0 && ppVar2 == (proxy *)0x0;
}

Assistant:

static bool compare(const T &a, const T &b)
		{
			return a == b;
		}